

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldInsertionIteratorsTest_MoveStrings_Test::
~RepeatedPtrFieldInsertionIteratorsTest_MoveStrings_Test
          (RepeatedPtrFieldInsertionIteratorsTest_MoveStrings_Test *this)

{
  RepeatedPtrFieldInsertionIteratorsTest::~RepeatedPtrFieldInsertionIteratorsTest
            (&this->super_RepeatedPtrFieldInsertionIteratorsTest);
  operator_delete(this,0x3c0);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldInsertionIteratorsTest, MoveStrings) {
  std::vector<std::string> src = {"a", "b", "c", "d"};
  std::vector<std::string> copy =
      src;  // copy since move leaves in undefined state
  TestAllTypes testproto;
  std::move(copy.begin(), copy.end(),
            RepeatedFieldBackInserter(testproto.mutable_repeated_string()));

  ASSERT_THAT(testproto.repeated_string(), testing::ElementsAreArray(src));
}